

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::UntypedMessage::InsertField<unsigned_long&>
          (UntypedMessage *this,Field *field,unsigned_long *value)

{
  variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
  *this_00;
  __index_type _Var1;
  pointer prVar2;
  unsigned_long *in_RCX;
  string *this_01;
  int32_t number;
  vector<unsigned_long,_std::allocator<unsigned_long>_> repeated;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> name;
  pair<_68213803_> emplace_result;
  int local_cc;
  undefined1 local_c8 [56];
  unsigned_long local_90;
  undefined1 local_88 [32];
  AlphaNum local_68;
  pair<_68213803_> local_38;
  
  local_cc = *(int *)(value[1] + 0x50);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
  ::try_emplace_impl<int_const&,unsigned_long&>(&local_38,&field->raw_,&local_cc,in_RCX);
  if (local_38.second != true) {
    if (*(int *)(value[1] + 0x4c) != 3) {
      local_c8._0_16_ =
           (undefined1  [16])
           absl::lts_20240722::NullSafeStringView("repeated entries for singular field number ");
      absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_88 + 0x20),local_cc);
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_88,(AlphaNum *)local_c8);
      absl::lts_20240722::InvalidArgumentError(this,local_88._8_8_,local_88._0_8_);
      this_01 = (string *)local_88;
LAB_002a5a80:
      std::__cxx11::string::~string(this_01);
      return (Status)(uintptr_t)this;
    }
    prVar2 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::iterator::operator->
                       (&local_38.first);
    this_00 = &prVar2->second;
    _Var1 = *(__index_type *)
             ((long)&(prVar2->second).
                     super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                     .
                     super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
             + 0x28);
    if (_Var1 == '\r') {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,in_RCX);
    }
    else {
      if (_Var1 != '\x04') {
        internal::RttiTypeName<unsigned_long>();
        if (local_68.digits_[0] == '\0') {
          std::optional<std::basic_string_view<char,std::char_traits<char>>>::operator=
                    ((optional<std::basic_string_view<char,std::char_traits<char>>> *)
                     (local_88 + 0x20),(char (*) [10])"<unknown>");
        }
        local_88._0_8_ =
             "inconsistent types for field number %d: tried to insert \'%s\', but index was %d";
        local_88._8_8_ = (char *)0x4e;
        local_90 = (unsigned_long)
                   (char)*(__index_type *)
                          ((long)&(prVar2->second).
                                  super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                                  .
                                  super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                                  .
                                  super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                                  .
                                  super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                                  .
                                  super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                                  .
                                  super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                          + 0x28);
        absl::lts_20240722::
        StrFormat<int,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                  ((string *)local_c8,
                   (FormatSpec<int,_std::basic_string_view<char>,_unsigned_long> *)local_88,
                   &local_cc,(basic_string_view<char,_std::char_traits<char>_> *)(local_88 + 0x20),
                   &local_90);
        absl::lts_20240722::InvalidArgumentError(this,local_c8._8_8_,local_c8._0_8_);
        this_01 = (string *)local_c8;
        goto LAB_002a5a80;
      }
      local_c8._0_16_ = ZEXT816(0);
      local_c8._16_8_ = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,
                 (unsigned_long *)this_00);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,in_RCX);
      std::
      variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>
      ::operator=((variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>
                   *)this_00,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
    }
  }
  this->desc_ = (Message *)0x1;
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status UntypedMessage::InsertField(const ResolverPool::Field& field,
                                         T&& value) {
  int32_t number = field.proto().number();
  auto emplace_result = fields_.try_emplace(number, std::forward<T>(value));
  if (emplace_result.second) {
    return absl::OkStatus();
  }

  if (field.proto().cardinality() !=
      google::protobuf::Field::CARDINALITY_REPEATED) {
    return absl::InvalidArgumentError(
        absl::StrCat("repeated entries for singular field number ", number));
  }

  Value& slot = emplace_result.first->second;
  using value_type = std::decay_t<T>;
  if (auto* extant = absl::get_if<value_type>(&slot)) {
    std::vector<value_type> repeated;
    repeated.push_back(std::move(*extant));
    repeated.push_back(std::forward<T>(value));

    slot = std::move(repeated);
  } else if (auto* extant = absl::get_if<std::vector<value_type>>(&slot)) {
    extant->push_back(std::forward<T>(value));
  } else {
    absl::optional<absl::string_view> name =
        google::protobuf::internal::RttiTypeName<value_type>();
    if (!name.has_value()) {
      name = "<unknown>";
    }

    return absl::InvalidArgumentError(
        absl::StrFormat("inconsistent types for field number %d: tried to "
                        "insert '%s', but index was %d",
                        number, *name, slot.index()));
  }

  return absl::OkStatus();
}